

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
          (Roaring64MapSetBitBiDirectionalIterator *this,Roaring64Map *parent,bool exhausted)

{
  bool bVar1;
  const_iterator cVar2;
  byte in_DL;
  undefined8 in_RSI;
  roaring_bitmap_t *in_RDI;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffb8;
  roaring_uint32_iterator_t *newit;
  const_iterator in_stack_ffffffffffffffc8;
  
  (in_RDI->high_low_container).size = (int)in_RSI;
  (in_RDI->high_low_container).allocation_size = (int)((ulong)in_RSI >> 0x20);
  std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
  _Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
             &(in_RDI->high_low_container).containers);
  (in_RDI->high_low_container).keys = (uint16_t *)0x0;
  (in_RDI->high_low_container).typecodes = (uint8_t *)0x0;
  (in_RDI->high_low_container).flags = '\0';
  *(undefined4 *)&(in_RDI->high_low_container).field_0x24 = 0;
  in_RDI[1].high_low_container.size = 0;
  in_RDI[1].high_low_container.allocation_size = 0;
  *(undefined4 *)&in_RDI[1].high_low_container.containers = 0;
  *(undefined1 *)((long)&in_RDI[1].high_low_container.containers + 4) = 0;
  if (((in_DL & 1) != 0) ||
     (bVar1 = std::
              map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              ::empty((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                       *)0x11d5ab), bVar1)) {
    cVar2 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                    *)in_stack_ffffffffffffffb8);
    (in_RDI->high_low_container).containers = (void **)cVar2._M_node;
  }
  else {
    cVar2 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                      *)in_stack_ffffffffffffffb8);
    (in_RDI->high_low_container).containers = (void **)cVar2._M_node;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x11d5ff
              );
    roaring_iterator_init(in_RDI,in_stack_ffffffffffffffb8);
    while (((*(byte *)((long)&in_RDI[1].high_low_container.containers + 4) ^ 0xff) & 1) != 0) {
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 in_stack_ffffffffffffffc8._M_node,(int)((ulong)in_RDI >> 0x20));
      newit = (roaring_uint32_iterator_t *)&(in_RDI->high_low_container).containers;
      in_stack_ffffffffffffffc8 =
           std::
           map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                   *)newit);
      bVar1 = std::operator==((_Self *)newit,(_Self *)&stack0xffffffffffffffc8);
      if (bVar1) {
        return;
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 0x11d67d);
      roaring_iterator_init(in_RDI,newit);
    }
  }
  return;
}

Assistant:

Roaring64MapSetBitBiDirectionalIterator(const Roaring64Map &parent,
                                            bool exhausted = false)
        : p(&parent.roarings) {
        if (exhausted || parent.roarings.empty()) {
            map_iter = p->cend();
        } else {
            map_iter = parent.roarings.cbegin();
            roaring_iterator_init(&map_iter->second.roaring, &i);
            while (!i.has_value) {
                map_iter++;
                if (map_iter == p->cend()) return;
                roaring_iterator_init(&map_iter->second.roaring, &i);
            }
        }
    }